

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall
CVmObjByteArray::getp_write_int(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  undefined8 in_RAX;
  undefined1 *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong start_idx;
  void *__src;
  ulong cnt;
  uchar cbuf [4];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (getp_write_int(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_write_int();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_write_int::desc);
  if (iVar3 != 0) {
    return 1;
  }
  uVar4 = CVmBif::pop_int_val();
  uVar5 = CVmBif::pop_int_val();
  iVar6 = CVmBif::pop_long_val();
  if ((uVar5 & 0xf) == 2) {
    cnt = 4;
  }
  else {
    if ((uVar5 & 0xf) != 1) {
      cnt = 1;
      bVar2 = true;
      goto LAB_00273505;
    }
    cnt = 2;
  }
  bVar2 = false;
LAB_00273505:
  if ((uVar4 != 0) &&
     (start_idx = (ulong)uVar4,
     (start_idx + cnt) - 1 <= (ulong)*(uint *)(this->super_CVmObject).ext_)) {
    iVar3 = (int)cnt;
    if (iVar3 == 4) {
      uStack_38 = CONCAT44(iVar6,(undefined4)uStack_38);
    }
    else if (iVar3 == 2) {
      uStack_38._0_6_ = CONCAT24((short)iVar6,(undefined4)uStack_38);
    }
    else if (iVar3 == 1) {
      uStack_38._0_5_ = CONCAT14((char)iVar6,(undefined4)uStack_38);
    }
    if ((uVar5 & 0xf0) == 0x10 && !bVar2) {
      uVar8 = 3;
      if (3 < cnt) {
        uVar8 = cnt;
      }
      puVar7 = (undefined1 *)((long)&uStack_38 + 4);
      lVar9 = 0;
      do {
        uVar1 = *puVar7;
        *puVar7 = *(undefined1 *)((long)&uStack_38 + lVar9 + (cnt - 0x35) + 0x38);
        *(undefined1 *)((long)&uStack_38 + lVar9 + (cnt - 0x35) + 0x38) = uVar1;
        lVar9 = lVar9 + -1;
        puVar7 = puVar7 + 1;
      } while (2 - uVar8 != lVar9);
    }
    save_undo(this,self,start_idx,cnt);
    __src = (void *)((long)&uStack_38 + 4);
    do {
      uVar4 = (uint)(start_idx - 1);
      uVar10 = (ulong)(uVar4 & 0x7fff);
      uVar8 = 0x8000 - uVar10;
      if (cnt <= uVar8) {
        uVar8 = cnt;
      }
      memcpy((void *)(uVar10 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                  (start_idx - 1 >> 0x1c) * 8 + 4) +
                                        (ulong)(uVar4 >> 0xc & 0xfff8))),__src,uVar8);
      __src = (void *)((long)__src + uVar8);
      start_idx = start_idx + uVar8;
      cnt = cnt - uVar8;
    } while (cnt != 0);
    retval->typ = VM_NIL;
    return 1;
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjByteArray::getp_write_int(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(3);
    unsigned int idx;
    unsigned int fmt;
    long val;
    size_t siz;
    unsigned char cbuf[4];

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the starting index, format code, and value to write */
    idx = CVmBif::pop_int_val(vmg0_);
    fmt = CVmBif::pop_int_val(vmg0_);
    val = CVmBif::pop_long_val(vmg0_);

    /* get the size from the format */
    switch (fmt & FmtSizeMask)
    {
    case FmtInt8:
    default:
        siz = 1;
        break;

    case FmtInt16:
        siz = 2;
        break;

    case FmtInt32:
        siz = 4;
        break;
    }

    /* check that the index is in range */
    if (idx < 1 || idx + siz - 1 > get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* write the value to cbuf[] */
    switch (siz)
    {
    case 1:
        /* 8-bit integer */
        cbuf[0] = (char)(val & 0xFF);
        break;

    case 2:
        /* 16-bit integer - start with our standard little-endian format */
        if ((fmt & FmtSignedMask) == FmtSigned)
            oswp2s(cbuf, (int)val);
        else
            oswp2(cbuf, (int)val);
        break;

    case 4:
        /* 32-bit integer - start with our standard little-endian format */
        if ((fmt & FmtSignedMask) == FmtSigned)
            oswp4s(cbuf, val);
        else
            oswp4(cbuf, val);
        break;
    }

    /* swap bytes if they want big-endian */
    if (siz > 1 && (fmt & FmtOrderMask) == FmtBigEndian)
        swap_bytes(cbuf, siz);

    /* save undo for the change */
    save_undo(vmg_ self, idx, siz);

    /* store the byte representation we've constructed */
    copy_from_buf(cbuf, idx, siz);
    
    /* there's no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}